

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser * init_parse_world(void)

{
  parser *p;
  
  p = parser_new();
  parser_reg(p,"map str mapname",parse_world_map);
  parser_reg(p,"help str text",parse_world_help);
  parser_reg(p,"level sym locality int depth sym topography",parse_world_level);
  parser_reg(p,"north sym locality int depth",parse_world_north);
  parser_reg(p,"east sym locality int depth",parse_world_east);
  parser_reg(p,"south sym locality int depth",parse_world_south);
  parser_reg(p,"west sym locality int depth",parse_world_west);
  parser_reg(p,"up sym locality int depth",parse_world_up);
  parser_reg(p,"down sym locality int depth",parse_world_down);
  parser_reg(p,"ego str name",parse_world_ego);
  return p;
}

Assistant:

static struct parser *init_parse_world(void) {
	struct parser *p = parser_new();

	parser_reg(p, "map str mapname", parse_world_map);
	parser_reg(p, "help str text", parse_world_help);
	parser_reg(p, "level sym locality int depth sym topography",
			   parse_world_level);
	parser_reg(p, "north sym locality int depth", parse_world_north);
	parser_reg(p, "east sym locality int depth", parse_world_east);
	parser_reg(p, "south sym locality int depth", parse_world_south);
	parser_reg(p, "west sym locality int depth", parse_world_west);
	parser_reg(p, "up sym locality int depth", parse_world_up);
	parser_reg(p, "down sym locality int depth", parse_world_down);
	parser_reg(p, "ego str name", parse_world_ego);
	return p;
}